

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildcard.c
# Opt level: O0

CURLcode Curl_wildcard_init(WildcardData *wc)

{
  curl_llist *pcVar1;
  WildcardData *wc_local;
  
  pcVar1 = Curl_llist_alloc(Curl_fileinfo_dtor);
  wc->filelist = pcVar1;
  if (wc->filelist == (curl_llist *)0x0) {
    wc_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    wc_local._4_4_ = CURLE_OK;
  }
  return wc_local._4_4_;
}

Assistant:

CURLcode Curl_wildcard_init(struct WildcardData *wc)
{
  DEBUGASSERT(wc->filelist == NULL);
  /* now allocate only wc->filelist, everything else
     will be allocated if it is needed. */
  wc->filelist = Curl_llist_alloc(Curl_fileinfo_dtor);
  if(!wc->filelist) {;
    return CURLE_OUT_OF_MEMORY;
  }
  return CURLE_OK;
}